

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall cmCTestP4::DescribeParser::DoBodyLine(DescribeParser *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  if (*(this->super_LineParser).Line._M_dataplus._M_p == '\t') {
    std::__cxx11::string::substr((ulong)local_30,(ulong)&(this->super_LineParser).Line);
    std::__cxx11::string::_M_append((char *)&(this->Rev).Log,(ulong)local_30[0]);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  std::__cxx11::string::append((char *)&(this->Rev).Log);
  return;
}

Assistant:

void DoBodyLine()
  {
    if (this->Line[0] == '\t') {
      this->Rev.Log += this->Line.substr(1);
    }
    this->Rev.Log += "\n";
  }